

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# superGate.c
# Opt level: O0

Vec_Str_t * Super_Write(Super_Man_t *pMan)

{
  int iVar1;
  char *pcVar2;
  abctime aVar3;
  char *local_50;
  ABC_PTRUINT_T Key;
  abctime clk;
  int v;
  int fZeroFound;
  stmm_generator *gen;
  Super_Gate_t_conflict *pGate;
  Super_Gate_t_conflict *pGateRoot;
  Vec_Str_t *vStr;
  Super_Man_t *pMan_local;
  
  vStr = (Vec_Str_t *)pMan;
  if (pMan->nGates < 1) {
    printf("The generated library is empty. No output file written.\n");
    pMan_local = (Super_Man_t *)0x0;
  }
  else {
    if (pMan->pGates != (Super_Gate_t_conflict **)0x0) {
      free(pMan->pGates);
      vStr[8].pArray = (char *)0x0;
    }
    pcVar2 = (char *)malloc((long)*(int *)((long)&vStr[10].pArray + 4) << 3);
    vStr[8].pArray = pcVar2;
    vStr[8].nCap = 0;
    _v = stmm_init_gen(*(stmm_table **)(vStr + 9));
    while (iVar1 = stmm_gen(_v,&local_50,(char **)&pGate), iVar1 != 0) {
      for (gen = (stmm_generator *)pGate; gen != (stmm_generator *)0x0;
          gen = (stmm_generator *)gen[4].entry) {
        if (gen->table != (stmm_table *)0x0) {
          clk._4_4_ = 0;
          for (clk._0_4_ = 0; (int)clk < *(int *)&vStr->pArray; clk._0_4_ = (int)clk + 1) {
            if (-9998.999 <= *(float *)((long)&gen[3].table + (long)(int)clk * 4 + 4)) {
              if (clk._4_4_ != 0) break;
            }
            else {
              clk._4_4_ = 1;
            }
          }
          if (*(int *)&vStr->pArray <= (int)clk) {
            iVar1 = vStr[8].nCap;
            vStr[8].nCap = iVar1 + 1;
            *(stmm_generator **)(vStr[8].pArray + (long)iVar1 * 8) = gen;
          }
        }
      }
    }
    stmm_free_gen(_v);
    Key = Abc_Clock();
    qsort(vStr[8].pArray,(long)vStr[8].nCap,8,Super_WriteCompare);
    iVar1 = Super_WriteCompare((Super_Gate_t_conflict **)vStr[8].pArray,
                               (Super_Gate_t_conflict **)
                               (vStr[8].pArray + (long)vStr[8].nCap * 8 + -8));
    if (0 < iVar1) {
      __assert_fail("Super_WriteCompare( pMan->pGates, pMan->pGates + pMan->nGates - 1 ) <= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/super/superGate.c"
                    ,0x402,"Vec_Str_t *Super_Write(Super_Man_t *)");
    }
    if (*(int *)&vStr[2].pArray != 0) {
      Abc_Print(1,"%s =","Sorting");
      aVar3 = Abc_Clock();
      Abc_Print(1,"%9.2f sec\n",((double)(long)(aVar3 - Key) * 1.0) / 1000000.0);
    }
    Key = Abc_Clock();
    if (vStr[2].nSize != 0) {
      Super_WriteLibrary((Super_Man_t *)vStr);
    }
    if (*(int *)&vStr[2].pArray != 0) {
      Abc_Print(1,"%s =","Writing old format");
      aVar3 = Abc_Clock();
      Abc_Print(1,"%9.2f sec\n",((double)(long)(aVar3 - Key) * 1.0) / 1000000.0);
    }
    Key = Abc_Clock();
    pGateRoot = (Super_Gate_t_conflict *)Super_WriteLibraryTreeStr((Super_Man_t *)vStr);
    if (*(int *)&vStr[2].pArray != 0) {
      Abc_Print(1,"%s =","Writing new format");
      aVar3 = Abc_Clock();
      Abc_Print(1,"%9.2f sec\n",((double)(long)(aVar3 - Key) * 1.0) / 1000000.0);
    }
    pMan_local = (Super_Man_t *)pGateRoot;
  }
  return (Vec_Str_t *)pMan_local;
}

Assistant:

Vec_Str_t * Super_Write( Super_Man_t * pMan )
{
    Vec_Str_t * vStr;
    Super_Gate_t * pGateRoot, * pGate;
    stmm_generator * gen;
    int fZeroFound, v;
    abctime clk;
    ABC_PTRUINT_T Key;

    if ( pMan->nGates < 1 )
    {
        printf( "The generated library is empty. No output file written.\n" );
        return NULL;
    }

    // Filters the supergates by removing those that have fewer inputs than 
    // the given limit, provided that the inputs are not consequtive. 
    // For example, NAND2(a,c) is removed, but NAND2(a,b) is left, 
    // because a and b are consequtive.
    ABC_FREE( pMan->pGates );
    pMan->pGates = ABC_ALLOC( Super_Gate_t *, pMan->nAdded );
    pMan->nGates = 0;
    stmm_foreach_item( pMan->tTable, gen, (char **)&Key, (char **)&pGateRoot )
    {
        for ( pGate = pGateRoot; pGate; pGate = pGate->pNext )
        {
            // skip the elementary variables
            if ( pGate->pRoot == NULL )
                continue;
            // skip the non-consequtive gates
            fZeroFound = 0;
            for ( v = 0; v < pMan->nVarsMax; v++ )
                if ( pGate->ptDelays[v] < SUPER_NO_VAR + SUPER_EPSILON )
                    fZeroFound = 1;
                else if ( fZeroFound )
                    break;
            if ( v < pMan->nVarsMax )
                continue;
            // save the unique gate
            pMan->pGates[ pMan->nGates++ ] = pGate;
        }
    }

clk = Abc_Clock();
    // sort the supergates by truth table
    qsort( (void *)pMan->pGates, (size_t)pMan->nGates, sizeof(Super_Gate_t *), 
            (int (*)(const void *, const void *)) Super_WriteCompare );
    assert( Super_WriteCompare( pMan->pGates, pMan->pGates + pMan->nGates - 1 ) <= 0 );
if ( pMan->fVerbose )
{
ABC_PRT( "Sorting", Abc_Clock() - clk );
}


    // write library in the old format
clk = Abc_Clock();
    if ( pMan->fWriteOldFormat )
        Super_WriteLibrary( pMan );
if ( pMan->fVerbose )
{
ABC_PRT( "Writing old format", Abc_Clock() - clk );
}

    // write the tree-like structure of supergates
clk = Abc_Clock();
    vStr = Super_WriteLibraryTreeStr( pMan );
if ( pMan->fVerbose )
{
ABC_PRT( "Writing new format", Abc_Clock() - clk );
}
    return vStr;
}